

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrinkStress.cpp
# Opt level: O3

void shrinkStress<2ul,3ul,unsigned_long,10ul,300ul,300ul,(char)48,(char)51>(uint32_t seed)

{
  pointer pcVar1;
  bool bVar2;
  Key<2UL> KVar3;
  pointer pcVar4;
  size_t __i;
  long lVar5;
  char cVar6;
  bool bVar7;
  long lVar8;
  string NEW_INDEX_FILENAME;
  anon_class_8_1_10d00a46 checkNewIndex;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  expectedNotSortedStorage;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  expectedSortedStorage;
  anon_class_16_2_b0a10a34 checkSorted;
  anon_class_16_2_fd180e1f checkNotSorted;
  anon_class_16_2_b8051694 shrinkExpected;
  anon_class_24_3_3cda8c2f checkStorage;
  mt19937 rand;
  undefined1 local_15b0 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1578;
  string local_1570;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> local_1550;
  value_type local_1540;
  _Head_base<0UL,_unsigned_char_*,_false> local_1530;
  shared_ptr<supermap::io::FileManager> local_1528;
  long local_1518;
  anon_class_8_1_10d00a46 local_1510;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  local_1508;
  _Any_data local_14e8;
  code *local_14d8;
  code *local_14d0;
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
  local_14c0;
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  local_1418;
  anon_class_16_2_b0a10a34 local_1400;
  anon_class_16_2_fd180e1f local_13f0;
  anon_class_16_2_b8051694 local_13e0;
  anon_class_24_3_3cda8c2f local_13d0;
  undefined1 local_13b8 [4992];
  size_t local_38;
  
  local_1570._M_dataplus._M_p = (pointer)&local_1570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"new-index","");
  local_1578 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_1578->_M_use_count = 1;
  local_1578->_M_weak_count = 1;
  local_1578->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ff088;
  local_1578[1]._vptr__Sp_counted_base = (_func_int **)memcmp;
  local_13b8._0_8_ = local_13b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b8,"keys-not-sorted","");
  pcVar1 = local_15b0 + 0x10;
  local_15b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15b0,"keys-sorted","");
  local_1528.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(local_1578 + 1);
  local_1528.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_1578;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_1578->_M_use_count = local_1578->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_1578->_M_use_count = local_1578->_M_use_count + 1;
  }
  local_14e8._M_unused._M_object = (void *)0x0;
  local_14e8._8_8_ = 0;
  local_14d0 = std::
               _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/test/shrinkStress.cpp:45:9)>
               ::_M_invoke;
  local_14d8 = std::
               _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/test/shrinkStress.cpp:45:9)>
               ::_M_manager;
  supermap::
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
  KeyValueShrinkableStorage
            (&local_14c0,(string *)local_13b8,(string *)local_15b0,&local_1528,
             (InnerRegisterSupplier *)&local_14e8);
  if (local_14d8 != (code *)0x0) {
    (*local_14d8)(&local_14e8,&local_14e8,__destroy_functor);
  }
  if (local_1528.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1528.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((pointer)local_15b0._0_8_ != pcVar1) {
    operator_delete((void *)local_15b0._0_8_,CONCAT71(local_15b0._17_7_,local_15b0[0x10]) + 1);
  }
  if ((undefined1 *)local_13b8._0_8_ != local_13b8 + 0x10) {
    operator_delete((void *)local_13b8._0_8_,local_13b8._16_8_ + 1);
  }
  lVar5 = 1;
  pcVar4 = (pointer)(ulong)seed;
  do {
    pcVar4 = (pointer)(ulong)(((uint)((ulong)pcVar4 >> 0x1e) ^ (uint)pcVar4) * 0x6c078965 +
                             (int)lVar5);
    *(pointer *)(local_13b8 + lVar5 * 8) = pcVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_38 = 0x270;
  lVar5 = 0;
  local_13f0.expectedNotSortedStorage = &local_1508;
  local_1508.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1508.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1510.expectedSortedStorage = &local_1418;
  local_1418.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1418.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.
  super__Vector_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1400.storage = &local_14c0;
  local_1400.expectedSortedStorage = local_1510.expectedSortedStorage;
  local_13f0.storage = local_1400.storage;
  local_13e0.expectedSortedStorage = local_1510.expectedSortedStorage;
  local_13e0.expectedNotSortedStorage = local_13f0.expectedNotSortedStorage;
  local_13d0.storage = local_1400.storage;
  local_13d0.expectedSortedStorage = local_1510.expectedSortedStorage;
  local_13d0.expectedNotSortedStorage = local_13f0.expectedNotSortedStorage;
  local_13b8._0_8_ = (pointer)(ulong)seed;
  do {
    lVar8 = 0;
    local_1518 = lVar5;
    do {
      local_15b0._8_8_ = (_func_int **)0x0;
      local_15b0[0x10] = '\0';
      bVar2 = true;
      local_15b0._0_8_ = pcVar1;
      do {
        bVar7 = bVar2;
        std::
        mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_13b8);
        cVar6 = (char)(KeyIndexStorage *)local_15b0;
        std::__cxx11::string::push_back(cVar6);
        bVar2 = false;
      } while (bVar7);
      KVar3 = supermap::Key<2UL>::fromString((string *)local_15b0);
      if ((pointer)local_15b0._0_8_ != pcVar1) {
        operator_delete((void *)local_15b0._0_8_,CONCAT71(local_15b0._17_7_,local_15b0[0x10]) + 1);
      }
      local_15b0._8_8_ = (_func_int **)0x0;
      local_15b0[0x10] = '\0';
      lVar5 = 3;
      local_15b0._0_8_ = pcVar1;
      do {
        std::
        mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_13b8);
        std::__cxx11::string::push_back(cVar6);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      supermap::ByteArray<3UL>::fromString((ByteArray<3UL> *)&local_1530,(string *)local_15b0);
      if ((pointer)local_15b0._0_8_ != pcVar1) {
        operator_delete((void *)local_15b0._0_8_,CONCAT71(local_15b0._17_7_,local_15b0[0x10]) + 1);
      }
      local_1540.value.data_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           local_1530._M_head_impl;
      local_1530._M_head_impl = (uchar *)0x0;
      local_1540.key = KVar3;
      std::
      vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
      ::push_back(&local_1508,&local_1540);
      local_1550.key.super_array<unsigned_char,_2UL>._M_elems =
           local_1540.key.super_array<unsigned_char,_2UL>._M_elems;
      local_1550.value.data_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)operator_new__(3);
      *(undefined1 *)
       ((long)local_1550.value.data_._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 2) = 0;
      *(undefined2 *)
       local_1550.value.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = 0;
      *(uchar *)((long)local_1550.value.data_._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 2) =
           *(uchar *)((long)local_1540.value.data_._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 2);
      *(undefined2 *)
       local_1550.value.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           *(undefined2 *)
            local_1540.value.data_._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      supermap::
      OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      ::appendCopy((OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                    *)&local_14c0,&local_1550);
      if (local_1550.value.data_._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
        operator_delete__((void *)local_1550.value.data_._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
      local_1550.value.data_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0;
      if (local_1540.value.data_._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
        operator_delete__((void *)local_1540.value.data_._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 300);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_b8051694::
    operator()(&local_13e0);
    lVar5 = local_1518;
    supermap::
    KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
    shrink((KeyIndexStorage *)local_15b0,&local_14c0,10,&local_1570);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_8_1_10d00a46::
    operator()(&local_1510,(KeyIndexStorage *)local_15b0);
    local_15b0._0_8_ = &PTR_append_002014c8;
    if (local_1588._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1588._M_pi);
    }
    local_15b0._0_8_ = &PTR___cxa_pure_virtual_00201540;
    local_15b0._8_8_ = &PTR_clone_00201570;
    if ((long *)local_15b0._24_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_15b0._24_8_ + 0x10))();
    }
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_24_3_3cda8c2f::
    operator()(&local_13d0);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_fd180e1f::
    operator()(&local_13f0);
    shrinkStress<2UL,_3UL,_unsigned_long,_10UL,_300UL,_300UL,_'0',_'3'>::anon_class_16_2_b0a10a34::
    operator()(&local_1400);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 300);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ::~vector(&local_1418);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>_>_>
  ::~vector(&local_1508);
  local_14c0.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00201370;
  if (local_14c0.innerRegisterSupplier_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_14c0.innerRegisterSupplier_.super__Function_base._M_manager)
              ((_Any_data *)&local_14c0.innerRegisterSupplier_,
               (_Any_data *)&local_14c0.innerRegisterSupplier_,__destroy_functor);
  }
  local_14c0.notSortedStorage_.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00200cb8;
  if (local_14c0.notSortedStorage_.storageFile_.
      super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14c0.notSortedStorage_.storageFile_.
               super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_14c0.notSortedStorage_.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00200b38;
  local_14c0.notSortedStorage_.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .register_.
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable =
       (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
        )&PTR_clone_00200b68;
  if ((_Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
       )local_14c0.notSortedStorage_.
        super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
        .register_.innerRegister_._M_t.
        super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
        .
        super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
       )0x0) {
    (*((Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>
        *)local_14c0.notSortedStorage_.
          super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          .register_.innerRegister_._M_t.
          super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          .
          super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
          ._M_head_impl)->_vptr_Cloneable[2])();
  }
  local_14c0.notSortedStorage_.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .register_.innerRegister_._M_t.
  super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
  .
  super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>,_true,_true>
        )(__uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          )0x0;
  local_14c0.sortedStorage_.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00200cb8;
  if (local_14c0.sortedStorage_.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14c0.sortedStorage_.
               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
               .storageFile_.
               super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_14c0.sortedStorage_.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00200b38;
  local_14c0.sortedStorage_.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .register_.
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable =
       (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
        )&PTR_clone_00200b68;
  if (local_14c0.sortedStorage_.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      .register_.innerRegister_._M_t.
      super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
      .
      super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
       )0x0) {
    (*((Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>
        *)local_14c0.sortedStorage_.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          .
          super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          .register_.innerRegister_._M_t.
          super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          .
          super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
          ._M_head_impl)->_vptr_Cloneable[2])();
  }
  local_14c0.sortedStorage_.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .register_.innerRegister_._M_t.
  super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
  .
  super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>,_true,_true>
        )(__uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
          )0x0;
  local_14c0.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00200b38;
  local_14c0.
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  .register_.
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable =
       (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
        )&PTR_clone_00200b68;
  if ((tuple<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
       )local_14c0.
        super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
        .register_.innerRegister_._M_t.
        super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
        .
        super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
       )0x0) {
    (**(code **)((long)*(Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>
                         *)local_14c0.
                           super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                           .
                           super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                           .register_.innerRegister_._M_t.
                           super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>
                           .
                           super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_*,_false>
                           ._M_head_impl + 0x10))();
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1570._M_dataplus._M_p != &local_1570.field_2) {
    operator_delete(local_1570._M_dataplus._M_p,local_1570.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void shrinkStress(std::uint32_t seed) {
    using namespace supermap;
    using K = Key<KeyLen>;
    using V = ByteArray<ValueLen>;
    using KV = KeyValue<Key<KeyLen>, ByteArray<ValueLen>>;
    using KI = KeyValue<K, IndexT>;
    using REG = VoidRegister<KI>;

    const std::string NEW_INDEX_FILENAME = "new-index";

    std::shared_ptr<io::FileManager> manager = std::make_shared<io::DiskFileManager>();
    KeyValueShrinkableStorage<K, V, IndexT, void> storage(
        "keys-not-sorted",
        "keys-sorted",
        manager,
        []() { return std::make_unique<REG>(); }
    );

    std::mt19937 rand(seed);

    auto randValue = [&]() {
        std::string v;
        for (std::size_t i = 0; i < ValueLen; ++i) {
            v += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return V::fromString(v);
    };
    auto randKey = [&]() {
        std::string k;
        for (std::size_t i = 0; i < KeyLen; ++i) {
            k += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return K::fromString(k);
    };

    std::vector<KV> expectedNotSortedStorage;
    std::vector<KV> expectedSortedStorage;

    auto appendToExpected = [&](const KV &kv) {
        expectedNotSortedStorage.push_back(kv);
    };

    auto shrinkExpected = [&]() {
        std::vector<KV> newSorted;
        for (auto sortedIt = expectedSortedStorage.begin(); sortedIt < expectedSortedStorage.end(); ++sortedIt) {
            newSorted.push_back(std::move(*sortedIt));
        }
        for (auto notSortedIt = expectedNotSortedStorage.begin(); notSortedIt < expectedNotSortedStorage.end();
             ++notSortedIt) {
            newSorted.push_back(std::move(*notSortedIt));
        }
        auto newSortedEnd = SortedSingleFileIndexedStorage<KV, IndexT, REG, K>::sortedEndIterator(
            newSorted.begin(),
            newSorted.end(),
            [](const KV &a, const KV &b) { return a.key < b.key; },
            [](const KV &a, const KV &b) { return a.key == b.key; }
        );
        expectedNotSortedStorage = {};
        expectedSortedStorage = {};
        for (auto it = newSorted.begin(); it < newSortedEnd; ++it) {
            expectedSortedStorage.push_back(std::move(*it));
        }
    };

    auto checkNotSorted = [&]() {
        std::vector<KV> actualNotSorted = storage.getNotSortedEntries().collect();
        CHECK_EQ(actualNotSorted.size(), expectedNotSortedStorage.size());
        CHECK_EQ(actualNotSorted, expectedNotSortedStorage);
    };

    auto checkSorted = [&]() {
        std::vector<KV> actualSorted = storage.getSortedEntries().collect();
        auto actualSortedSize = actualSorted.size();
        auto expectedSortedSize = expectedSortedStorage.size();
        CHECK_EQ(actualSortedSize, expectedSortedSize);
        CHECK_EQ(actualSorted, expectedSortedStorage);
    };

    auto checkStorage = [&]() {
        CHECK_EQ(storage.getItemsCount(), expectedSortedStorage.size() + expectedNotSortedStorage.size());
        CHECK_EQ(storage.getNotSortedItemsCount(), expectedNotSortedStorage.size());
        CHECK_EQ(storage.getSortedItemsCount(), expectedSortedStorage.size());
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i), expectedSortedStorage[i]);
        }
        for (IndexT i = 0; i < expectedNotSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i + expectedSortedStorage.size()), expectedNotSortedStorage[i]);
        }
    };

    auto checkNewIndex = [&](const SortedSingleFileIndexedStorage<KI, IndexT, void, K> &newIndex) {
        auto newIndexSize = newIndex.getItemsCount();
        auto sortedSize = expectedSortedStorage.size();
        CHECK_EQ(newIndexSize, sortedSize);
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            IndexT curInd = newIndex.get(i).value;
            K curKey = newIndex.get(i).key;
            K expectedKey = expectedSortedStorage[i].key;
            CHECK_EQ(curInd, i);
            CHECK_EQ(curKey, expectedKey);
        }
    };

    for (std::size_t iter = 0; iter < Iterations; ++iter) {
        for (std::size_t step = 0; step < IterationLen; ++step) {
            KV randKV(randKey(), randValue());
            appendToExpected(randKV);
            storage.appendCopy(randKV);
        }
        shrinkExpected();
        checkNewIndex(storage.shrink(BatchSize, NEW_INDEX_FILENAME));
        checkStorage();
        checkNotSorted();
        checkSorted();
    }
}